

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeClearTable(Btree *p,int iTable,i64 *pnChange)

{
  BtShared *pBt_00;
  BtShared *pBt;
  int rc;
  i64 *pnChange_local;
  int iTable_local;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  sqlite3BtreeEnter(p);
  pBt._4_4_ = saveAllCursors(pBt_00,iTable,(BtCursor *)0x0);
  if (pBt._4_4_ == 0) {
    if (p->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(p,iTable,0,1);
    }
    pBt._4_4_ = clearDatabasePage(pBt_00,iTable,0,pnChange);
  }
  sqlite3BtreeLeave(p);
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClearTable(Btree *p, int iTable, i64 *pnChange){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );

  rc = saveAllCursors(pBt, (Pgno)iTable, 0);

  if( SQLITE_OK==rc ){
    /* Invalidate all incrblob cursors open on table iTable (assuming iTable
    ** is the root of a table b-tree - if it is not, the following call is
    ** a no-op).  */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, (Pgno)iTable, 0, 1);
    }
    rc = clearDatabasePage(pBt, (Pgno)iTable, 0, pnChange);
  }
  sqlite3BtreeLeave(p);
  return rc;
}